

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O3

UChar * icu_63::PatternProps::trimWhiteSpace(UChar *s,int32_t *length)

{
  UChar UVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = *length;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    return s;
  }
  UVar1 = *s;
  if ((ushort)UVar1 < 0x100) {
    bVar5 = (bool)((byte)latin1[(ushort)UVar1] >> 2 & 1);
LAB_0029a359:
    if (bVar5 == false) goto LAB_0029a35e;
  }
  else {
    if ((ushort)UVar1 - 0x200e < 0x1c) {
      bVar5 = (ushort)UVar1 - 0x2028 < 0xffffffe8;
      goto LAB_0029a359;
    }
LAB_0029a35e:
    UVar1 = s[uVar3 - 1];
    if ((ushort)UVar1 < 0x100) {
      bVar5 = (bool)((byte)latin1[(ushort)UVar1] >> 2 & 1);
    }
    else {
      if (0x1b < (ushort)UVar1 - 0x200e) {
        return s;
      }
      bVar5 = (ushort)UVar1 - 0x2028 < 0xffffffe8;
    }
    if (bVar5 == false) {
      return s;
    }
  }
  uVar4 = 0;
  do {
    UVar1 = s[uVar4];
    if ((ushort)UVar1 < 0x100) {
      bVar5 = (bool)((byte)latin1[(ushort)UVar1] >> 2 & 1);
    }
    else {
      if (0x1b < (ushort)UVar1 - 0x200e) goto LAB_0029a3f3;
      bVar5 = (ushort)UVar1 - 0x2028 < 0xffffffe8;
    }
    if (bVar5 == false) goto LAB_0029a3f3;
    uVar4 = uVar4 + 1;
  } while (uVar3 != uVar4);
LAB_0029a438:
  *length = uVar2 - (int)uVar3;
  return s + uVar3;
LAB_0029a3f3:
  UVar1 = s[uVar3 - 1];
  if ((ushort)UVar1 < 0x100) {
    bVar5 = (bool)((byte)latin1[(ushort)UVar1] >> 2 & 1);
  }
  else {
    if (0x1b < (ushort)UVar1 - 0x200e) goto LAB_0029a434;
    bVar5 = (ushort)UVar1 - 0x2028 < 0xffffffe8;
  }
  if (bVar5 == false) goto LAB_0029a434;
  uVar3 = uVar3 - 1;
  goto LAB_0029a3f3;
LAB_0029a434:
  uVar2 = (uint)uVar3;
  uVar3 = uVar4 & 0xffffffff;
  goto LAB_0029a438;
}

Assistant:

const UChar *
PatternProps::trimWhiteSpace(const UChar *s, int32_t &length) {
    if(length<=0 || (!isWhiteSpace(s[0]) && !isWhiteSpace(s[length-1]))) {
        return s;
    }
    int32_t start=0;
    int32_t limit=length;
    while(start<limit && isWhiteSpace(s[start])) {
        ++start;
    }
    if(start<limit) {
        // There is non-white space at start; we will not move limit below that,
        // so we need not test start<limit in the loop.
        while(isWhiteSpace(s[limit-1])) {
            --limit;
        }
    }
    length=limit-start;
    return s+start;
}